

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O0

vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fasttext::Vector>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fasttext::Vector>_>_>
* __thiscall fasttext::FastText::getNgramVectors(FastText *this,string *word)

{
  vector<int,_std::allocator<int>_> *this_00;
  vector<int,_std::allocator<int>_> *pvVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__args;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  reference pvVar3;
  Matrix *in_RDI;
  Vector vec;
  int32_t i;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  substrings;
  vector<int,_std::allocator<int>_> ngrams;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fasttext::Vector>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fasttext::Vector>_>_>
  *result;
  int64_t in_stack_ffffffffffffff48;
  element_type *in_stack_ffffffffffffff50;
  Matrix *this_01;
  int local_60;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_50;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffffc8;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffffd0;
  string *in_stack_ffffffffffffffd8;
  undefined7 in_stack_ffffffffffffffe0;
  undefined1 uVar4;
  byte bVar5;
  
  uVar4 = 0;
  this_01 = in_RDI;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fasttext::Vector>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fasttext::Vector>_>_>
  ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fasttext::Vector>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fasttext::Vector>_>_>
            *)0x1bbfd6);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x1bbfe8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x1bbff7);
  std::__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x1bc005);
  Dictionary::getSubwords
            ((Dictionary *)CONCAT17(uVar4,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffd8,
             in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  this_00 = (vector<int,_std::allocator<int>_> *)
            std::vector<int,_std::allocator<int>_>::size
                      ((vector<int,_std::allocator<int>_> *)&stack0xffffffffffffffc8);
  pvVar1 = (vector<int,_std::allocator<int>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::size(&local_50);
  if (this_00 <= pvVar1) {
    local_60 = 0;
    while( true ) {
      __args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(long)local_60;
      pbVar2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::vector<int,_std::allocator<int>_>::size
                         ((vector<int,_std::allocator<int>_> *)&stack0xffffffffffffffc8);
      if (pbVar2 <= __args) break;
      std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x1bc0b8);
      Vector::Vector((Vector *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)&stack0xffffffffffffffc8,
                          (long)local_60);
      if (-1 < *pvVar3) {
        in_stack_ffffffffffffff50 =
             std::__shared_ptr_access<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator*((__shared_ptr_access<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)in_stack_ffffffffffffff50);
        std::vector<int,_std::allocator<int>_>::operator[]
                  ((vector<int,_std::allocator<int>_> *)&stack0xffffffffffffffc8,(long)local_60);
        Vector::addRow((Vector *)this_01,in_RDI,(int64_t)this_00);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[](&local_50,(long)local_60);
      std::
      vector<std::pair<std::__cxx11::string,fasttext::Vector>,std::allocator<std::pair<std::__cxx11::string,fasttext::Vector>>>
      ::emplace_back<std::__cxx11::string&,fasttext::Vector>
                ((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fasttext::Vector>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fasttext::Vector>_>_>
                  *)this_00,__args,(Vector *)in_stack_ffffffffffffff50);
      Vector::~Vector((Vector *)0x1bc164);
      local_60 = local_60 + 1;
    }
    bVar5 = 1;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)this_00);
    std::vector<int,_std::allocator<int>_>::~vector(this_00);
    if ((bVar5 & 1) == 0) {
      std::
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fasttext::Vector>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fasttext::Vector>_>_>
      ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fasttext::Vector>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fasttext::Vector>_>_>
                 *)this_00);
    }
    return (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fasttext::Vector>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fasttext::Vector>_>_>
            *)this_01;
  }
  __assert_fail("ngrams.size() <= substrings.size()",
                "/workspace/llm4binary/github/license_c_cmakelists/facebookresearch[P]fastText/src/fasttext.cc"
                ,0x211,
                "std::vector<std::pair<std::string, Vector>> fasttext::FastText::getNgramVectors(const std::string &) const"
               );
}

Assistant:

std::vector<std::pair<std::string, Vector>> FastText::getNgramVectors(
    const std::string& word) const {
  std::vector<std::pair<std::string, Vector>> result;
  std::vector<int32_t> ngrams;
  std::vector<std::string> substrings;
  dict_->getSubwords(word, ngrams, substrings);
  assert(ngrams.size() <= substrings.size());
  for (int32_t i = 0; i < ngrams.size(); i++) {
    Vector vec(args_->dim);
    if (ngrams[i] >= 0) {
      vec.addRow(*input_, ngrams[i]);
    }
    result.emplace_back(substrings[i], std::move(vec));
  }
  return result;
}